

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O1

Error asmjit::v1_14::x86::InstInternal::validate
                (Mode mode,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  Error EVar6;
  InstInfo *pIVar7;
  ulong uVar8;
  OpSignature OVar9;
  OpSignature OVar10;
  ValidationFlags validationFlags_00;
  ulong uVar11;
  OpSignature OVar12;
  int iVar13;
  ulong uVar14;
  OpSignature OVar15;
  size_t opCount_00;
  uint uVar16;
  Operand_ *pOVar17;
  OpSignature OVar18;
  byte bVar19;
  undefined7 in_register_00000039;
  uint *puVar20;
  uint uVar21;
  OpSignature OVar22;
  byte bVar23;
  uint uVar24;
  OpSignature index;
  uint uVar25;
  InstSignature *this;
  uint uVar26;
  InstSignature *pIStack_e0;
  Error local_d8;
  bool localImmOutOfRange;
  Operand_ *local_d0;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  undefined8 local_b8;
  uint local_ac;
  OpSignature local_a8;
  undefined1 *local_a0;
  OpSignature local_98;
  uint local_8c;
  BaseInst *local_88;
  InstSignature *local_80;
  uint local_74;
  Operand_ *local_70;
  OpSignature oSigTranslated [6];
  
  local_98._0_4_ = validationFlags;
  local_c8 = (uint)CONCAT71(in_register_00000039,mode);
  local_a0 = _x64ValidationData;
  if (local_c8 == 1) {
    local_a0 = _x86ValidationData;
  }
  pIStack_e0 = (InstSignature *)(ulong)*(uint *)inst;
  if (*(uint *)inst < 0x6bb) {
    uVar26 = *(uint *)(inst + 4);
    local_88 = inst;
    pIVar7 = InstDB::infoById((InstDB *)pIStack_e0,(InstId)inst);
    local_c0 = (ulong)(*(uint *)pIVar7 >> 0xe & 0x3ff);
    local_c4 = *(uint *)(InstDB::_commonInfoTable + local_c0 * 8);
    if ((uVar26 & 0x32000) != 0) {
      if ((uVar26 >> 0xd & 1) != 0) {
        local_d8 = 0x21;
        if ((local_c4 >> 0x10 & 1) == 0) {
          if (opCount == 0) {
            return 0x21;
          }
          if ((uVar26 & 0x30000) == 0) {
            return 0x21;
          }
        }
        else if (opCount == 0) {
          return 0x21;
        }
        if (((operands->_signature)._bits & 7) != 2) {
          return 0x21;
        }
      }
      if ((uVar26 & 0x30000) != 0) {
        if ((uVar26 >> 0xd & 1) == 0) {
          return 0x20;
        }
        if ((uVar26 & 0x30000) == 0x30000) {
          return 0x20;
        }
        if (((uVar26 >> 0x10 & 1) != 0) && ((local_c4 & 0x20000) == 0)) {
          return 0x22;
        }
        if (((uVar26 >> 0x11 & 1) != 0) && ((local_c4 & 0x40000) == 0)) {
          return 0x23;
        }
      }
    }
    local_8c = uVar26 & 0xc000;
    if (local_8c != 0) {
      if (local_8c == 0xc000) {
        return 0x20;
      }
      local_d8 = 0x20;
      if ((local_c4 >> 0xe & 1) == 0) {
        return 0x24;
      }
    }
    local_74 = 0xc6;
    if ((byte)local_c8 == '\x01') {
      local_74 = 0x66;
    }
    uVar5 = 0x70c0;
    if ((byte)local_c8 == '\x01') {
      uVar5 = 0x7060;
    }
    local_80 = (InstSignature *)CONCAT44(local_80._4_4_,uVar5);
    uVar8 = 0;
    local_d0 = (Operand_ *)0x0;
    local_b8 = (InstSignature *)((ulong)local_b8._4_4_ << 0x20);
    uVar21 = 0;
    while( true ) {
      iVar13 = 1;
      OVar22._4_4_ = 0;
      OVar22._0_4_ = uVar21;
      if (opCount <= (ulong)OVar22) break;
      uVar25 = operands[(long)OVar22]._signature._bits;
      if (5 < (uVar25 & 7)) {
switchD_0014628d_caseD_3:
        local_d8 = 3;
        goto LAB_00146430;
      }
      pOVar17 = operands + (long)OVar22;
      inst = (BaseInst *)0x0;
      OVar18 = (OpSignature)0x0;
      switch(uVar25 & 7) {
      case 0:
        iVar13 = 2;
        break;
      case 1:
        uVar25 = uVar25 >> 3 & 0x1f;
        if ((0xfe018f07U >> uVar25 & 1) == 0) {
          uVar24 = pOVar17->_baseId;
          if (uVar24 < 0x100) {
            if (uVar24 < 0x20) {
              inst._0_4_ = 1 << ((byte)uVar24 & 0x1f);
              inst._4_4_ = 0;
              if ((*(uint *)(local_a0 + (ulong)uVar25 * 4) >> (uVar24 & 0x1f) & 1) != 0) {
                local_b8 = (InstSignature *)CONCAT44(local_b8._4_4_,(uint)local_b8 | (uint)inst);
                goto LAB_001463fd;
              }
            }
            pIStack_e0 = (InstSignature *)0x1d;
            goto LAB_001463c7;
          }
          if (((ulong)local_98 & 1) == 0) {
            pIStack_e0 = (InstSignature *)0x3e;
            goto LAB_001463c7;
          }
          inst = (BaseInst *)0xffffffff;
LAB_001463fd:
          bVar3 = true;
          iVar13 = 5;
        }
        else {
          pIStack_e0 = (InstSignature *)0x1b;
LAB_001463c7:
          inst = (BaseInst *)0x0;
          bVar3 = false;
          local_d8 = (Error)pIStack_e0;
        }
        if (bVar3) {
          uVar11 = *(ulong *)(_x86OpFlagFromRegType + (ulong)uVar25 * 8);
          goto LAB_00146414;
        }
        break;
      case 2:
        if ((~uVar25 & 0x1c0000) == 0) {
          uVar11 = 0;
          OVar18 = (OpSignature)0x0;
          pIStack_e0 = (InstSignature *)0x31;
LAB_001462c2:
          iVar13 = 1;
          bVar1 = false;
          local_d8 = (Error)pIStack_e0;
          inst = (BaseInst *)OVar18;
        }
        else {
          uVar24 = uVar25 >> 0x18;
          if ((uVar25 & 0xe00000) != 0) {
            if (uVar25 < 0x1000000) {
              uVar24 = 8;
              if ((*(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) & 0x40) == 0) {
                uVar24 = ((*(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) & 0x20) >> 4) + 2;
              }
            }
            else if (((uVar24 != 4) &&
                     ((*(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) & 0x20) != 0)) ||
                    ((uVar24 != 8 &&
                     ((*(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) & 0x40) != 0)))) {
              uVar11 = 0;
              OVar18 = (OpSignature)0x0;
              pIStack_e0 = (InstSignature *)0x29;
              goto LAB_001462c2;
            }
            uVar24 = uVar24 << ((byte)(uVar25 >> 0x15) & 7);
          }
          bVar19 = (byte)uVar25;
          bVar4 = bVar19 >> 3;
          pIStack_e0 = (InstSignature *)(ulong)CONCAT31((int3)(uVar25 >> 8),bVar4);
          bVar23 = (byte)(uVar25 >> 8) & 0x1f;
          if (bVar19 < 0x10) {
            if (bVar4 == 1) {
              uVar11 = 0;
              OVar18 = (OpSignature)0x0;
LAB_0014665a:
              uVar16 = OVar18._0_4_;
              if ((uVar25 & 0x1f00) != 0) {
                if ((uVar5 >> (uVar25 >> 8 & 0x1f) & 1) != 0) {
                  if (bVar23 == 0xe) {
                    uVar14 = 0x900000000;
LAB_001466a3:
                    uVar11 = uVar11 | uVar14;
                  }
                  else {
                    if (bVar23 == 0xd) {
                      uVar14 = 0x480000000;
                      goto LAB_001466a3;
                    }
                    if (bVar23 == 0xc) {
                      uVar14 = 0x240000000;
                      goto LAB_001466a3;
                    }
                    if (7 < bVar19) {
                      uVar11 = uVar11 | 0x8000000000000;
                    }
                  }
                  if ((bVar4 != 2) || ((uVar11 & 0xfc0000000) == 0)) {
                    uVar25 = pOVar17->_data[0];
                    if (uVar25 < 0x100) {
                      if (0x1f < uVar25) {
                        local_d8 = 0x1d;
                        goto LAB_0014670d;
                      }
                      local_b8 = (InstSignature *)
                                 CONCAT44(local_b8._4_4_,(uint)local_b8 | 1 << (uVar25 & 0x1f));
LAB_00146713:
                      bVar3 = true;
                      OVar18 = (OpSignature)0x0;
                    }
                    else {
                      if (((ulong)local_98 & 1) != 0) goto LAB_00146713;
                      local_d8 = 0x3e;
LAB_0014670d:
                      bVar3 = false;
                    }
                    uVar16 = OVar18._0_4_;
                    if (!bVar3) goto LAB_0014674a;
                    goto LAB_0014671b;
                  }
                }
                pIStack_e0 = (InstSignature *)0x2b;
                goto LAB_001462c2;
              }
LAB_0014671b:
              OVar18._4_4_ = 0;
              OVar18._0_4_ = uVar16;
              puVar20 = &switchD_00146737::switchdataD_001655c8;
              switch(uVar24) {
              case 0:
                uVar11 = uVar11 | 0x40000;
                break;
              case 1:
                uVar11 = uVar11 | 0x80000;
                break;
              case 2:
                uVar11 = uVar11 | 0x100000;
                break;
              case 3:
              case 5:
              case 7:
              case 9:
              case 0xb:
              case 0xc:
              case 0xd:
              case 0xe:
              case 0xf:
switchD_00146737_caseD_3:
                pIStack_e0 = (InstSignature *)0x33;
                goto LAB_001462c2;
              case 4:
                uVar11 = uVar11 | 0x200000;
                break;
              case 6:
                uVar11 = uVar11 | 0x400000;
                break;
              case 8:
                uVar11 = uVar11 | 0x800000;
                break;
              case 10:
                uVar11 = uVar11 | 0x1000000;
                break;
              case 0x10:
                uVar11 = uVar11 | 0x2000000;
                break;
              default:
                puVar20 = (uint *)pIStack_e0;
                if (uVar24 == 0x20) {
                  uVar11 = uVar11 | 0x4000000;
                }
                else {
                  if (uVar24 != 0x40) goto switchD_00146737_caseD_3;
                  uVar11 = uVar11 | 0x8000000;
                }
              }
              bVar1 = true;
              iVar13 = 5;
              inst = (BaseInst *)OVar18;
              pIStack_e0 = (InstSignature *)puVar20;
            }
            else {
              if (bVar19 < 8) {
                uVar11 = CONCAT44(pOVar17->_baseId,pOVar17->_data[1]);
              }
              else {
                uVar11 = (ulong)(int)pOVar17->_data[1];
              }
              bVar3 = true;
              if ((long)(int)uVar11 != uVar11) {
                if ((byte)local_c8 == '\x01') {
                  bVar3 = uVar11 >> 0x20 == 0;
                  EVar6 = 0x2e;
LAB_00146630:
                  if (!bVar3) {
                    local_d8 = EVar6;
                  }
                }
                else if ((uVar25 & 0x1f00) != 0) {
                  if (uVar11 >> 0x20 == 0) {
                    bVar3 = bVar23 == 6;
                    EVar6 = 0x2f;
                    goto LAB_00146630;
                  }
                  bVar3 = false;
                  local_d8 = 0x2e;
                }
              }
              uVar11 = 0;
              OVar18 = (OpSignature)0x0;
              bVar1 = false;
              iVar13 = 1;
              inst = (BaseInst *)(OpSignature)0x0;
              local_ac = uVar26;
              if (bVar3) goto LAB_0014665a;
            }
          }
          else {
            uVar16 = pOVar17->_baseId;
            if (((uVar25 >> 0xd & 1) == 0) && ((local_74 >> bVar4 & 1) == 0)) {
              local_d8 = 0x2b;
LAB_00146539:
              OVar18 = (OpSignature)0x0;
              uVar11 = 0;
              bVar3 = false;
            }
            else {
              if (0xff < uVar16) {
                if (((ulong)local_98 & 1) != 0) {
                  OVar18 = (OpSignature)0xffffffff;
                  goto LAB_001465b3;
                }
                local_d8 = 0x3e;
                goto LAB_00146539;
              }
              if (0x1f < uVar16) {
                local_d8 = 0x1d;
                goto LAB_00146539;
              }
              OVar18._0_4_ = 1 << ((byte)uVar16 & 0x1f);
              OVar18._4_4_ = 0;
              local_b8 = (InstSignature *)
                         CONCAT44(local_b8._4_4_,(uint)local_b8 | 1 << (uVar16 & 0x1f));
LAB_001465b3:
              bVar3 = true;
              uVar11 = 0;
              if ((uVar25 & 0x1f00) == 0) {
                uVar11 = (ulong)(pOVar17->_data[1] == 0) << 0x30;
              }
            }
            if (bVar3) goto LAB_0014665a;
LAB_0014674a:
            bVar1 = false;
            iVar13 = 1;
            inst = (BaseInst *)OVar18;
          }
        }
        local_d0 = pOVar17;
        if (bVar1) goto LAB_00146414;
        break;
      case 3:
        goto switchD_0014628d_caseD_3;
      case 4:
        uVar11 = *(ulong *)pOVar17->_data;
        pIStack_e0 = (InstSignature *)(ulong)pOVar17->_data[1];
        if ((long)pIStack_e0 << 0x20 < 0) {
          uVar11 = -uVar11;
          if (uVar11 < 9) {
            uVar11 = 0x155000000000;
            inst = (BaseInst *)OVar18;
          }
          else if (uVar11 < 0x81) {
            uVar11 = 0x154000000000;
            inst = (BaseInst *)OVar18;
          }
          else if (uVar11 < 0x8001) {
            uVar11 = 0x150000000000;
            inst = (BaseInst *)OVar18;
          }
          else {
            pIStack_e0 = (InstSignature *)0x80000001;
            uVar11 = ((ulong)(uVar11 < 0x80000001) | 4) << 0x2a;
            inst = (BaseInst *)OVar18;
          }
        }
        else if (uVar11 < 8) {
          uVar11 = 0x3ff000000000;
        }
        else if (uVar11 < 0x10) {
          uVar11 = 0x3fe000000000;
        }
        else if (uVar11 < 0x80) {
          uVar11 = 0x3fc000000000;
          inst = (BaseInst *)OVar18;
        }
        else if (uVar11 < 0x100) {
          uVar11 = 0x3f8000000000;
          inst = (BaseInst *)OVar18;
        }
        else if (uVar11 < 0x8000) {
          uVar11 = 0x3f0000000000;
          inst = (BaseInst *)OVar18;
        }
        else if (uVar11 < 0x10000) {
          uVar11 = 0x3e0000000000;
          inst = (BaseInst *)OVar18;
        }
        else if (uVar11 < 0x80000000) {
          uVar11 = 0x3c0000000000;
          inst = (BaseInst *)OVar18;
        }
        else {
          uVar11 = ((ulong)(pOVar17->_data[1] == 0) | 6) << 0x2b;
          inst = (BaseInst *)OVar18;
        }
        goto LAB_00146414;
      case 5:
        uVar11 = 0xc00000000000;
LAB_00146414:
        inst = (BaseInst *)((long)inst << 0x38 | uVar11 & 0xffffffffffffff);
        oSigTranslated[(long)OVar22] = (OpSignature)inst;
        uVar8 = uVar8 | uVar11;
        iVar13 = 0;
      }
LAB_00146430:
      if (iVar13 != 0) {
        if (iVar13 != 2) {
          return local_d8;
        }
        break;
      }
      uVar21 = uVar21 + 1;
    }
    OVar18 = (OpSignature)opCount;
    if ((ulong)OVar22 < opCount) {
      OVar18 = (OpSignature)(opCount - 1);
      if ((ulong)OVar22 <= opCount - 1) {
        OVar18 = OVar22;
      }
      inst = (BaseInst *)(operands + opCount);
      OVar15 = (OpSignature)opCount;
      while( true ) {
        inst = (BaseInst *)((long)inst + -0x10);
        OVar15 = (OpSignature)((long)((Operand_ *)((long)OVar15 + -0x10))->_data + 7);
        if ((ulong)OVar15 <= (ulong)OVar22) break;
        if (*(int *)inst != 0) {
          return 0x1a;
        }
      }
    }
    if ((byte)local_c8 == '\x01') {
      if ((uVar8 & 0x10) != 0) {
        return 0x3a;
      }
    }
    else {
      if ((((byte)local_88[7] & 0x40) == 0) && ((uint)local_b8 < 0x100)) {
        cVar2 = '\0';
      }
      else {
        cVar2 = (char)(((uint)uVar8 & 2) >> 1);
      }
      if (cVar2 != '\0') {
        return 0x39;
      }
    }
    uVar5 = *(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) >> 0x16 & 0x1f;
    local_a8 = (OpSignature)opCount;
    local_70 = operands;
    if (uVar5 != 0) {
      this = (InstSignature *)
             (InstDB::_instSignatureTable +
             (*(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) >> 8 & 0x3ff8));
      local_80 = this + uVar5;
      local_c8 = local_c8 & 0xffffff03;
      local_a0 = (undefined1 *)((ulong)local_a0 & 0xffffffff00000000);
      local_ac = uVar26;
      local_a8 = OVar18;
      do {
        bVar4 = *(byte *)this;
        if (((byte)local_c8 & bVar4 >> 3) != 0) {
          OVar15._0_4_ = bVar4 & 7;
          OVar15._4_4_ = 0;
          localImmOutOfRange = false;
          if (OVar18 == OVar15) {
            for (uVar26 = 0; inst._4_4_ = 0, inst._0_4_ = uVar26, inst < (ulong)OVar18;
                uVar26 = uVar26 + 1) {
              pIStack_e0 = (InstSignature *)(oSigTranslated + (long)inst);
              inst = (BaseInst *)InstDB::InstSignature::opSignature(this,(size_t)inst);
              bVar3 = x86CheckOSig((OpSignature *)pIStack_e0,(OpSignature *)inst,&localImmOutOfRange
                                  );
              if (!bVar3) break;
            }
          }
          else {
            OVar12._0_4_ = OVar15._0_4_ - (bVar4 >> 5);
            OVar12._4_4_ = 0;
            uVar26 = 0;
            if (OVar18 == OVar12) {
              uVar26 = 0;
              index = (OpSignature)0x0;
              local_98 = OVar15;
              while ((OVar9._4_4_ = 0, OVar9._0_4_ = uVar26, OVar18 = local_a8,
                     (ulong)OVar9 < (ulong)local_a8 && (index._0_4_ < local_98._0_4_))) {
                local_b8 = (InstSignature *)(oSigTranslated + (long)OVar9);
                do {
                  inst = (BaseInst *)index;
                  pIStack_e0 = this;
                  bVar4 = InstDB::InstSignature::opSignatureIndex(this,(size_t)index);
                  if ((InstDB::_opSignatureTable[(ulong)bVar4 * 8 + 6] & 0x80) == 0) {
                    inst = (BaseInst *)(InstDB::_opSignatureTable + (ulong)bVar4 * 8);
                    pIStack_e0 = local_b8;
                    bVar3 = x86CheckOSig((OpSignature *)local_b8,(OpSignature *)inst,
                                         &localImmOutOfRange);
                    goto LAB_00146a44;
                  }
                  index = (OpSignature)((long)index + 1);
                } while ((ulong)index < (undefined1 *)(ulong)(byte)OVar15._0_4_);
                bVar3 = false;
LAB_00146a44:
                OVar18 = local_a8;
                if (bVar3 == false) break;
                uVar26 = uVar26 + 1;
                index._0_4_ = index._0_4_ + 1;
                index._4_4_ = 0;
              }
            }
          }
          OVar10._4_4_ = 0;
          OVar10._0_4_ = uVar26;
          uVar26 = (uint)local_a0 & 0xff;
          if (OVar18 == OVar10) {
            uVar26 = (uint)localImmOutOfRange;
          }
          local_a0 = (undefined1 *)CONCAT44(local_a0._4_4_,uVar26);
          uVar26 = local_ac;
          if ((localImmOutOfRange & 1U) == 0 && OVar18 == OVar10) break;
        }
        this = this + 1;
      } while (this != local_80);
      EVar6 = 0x1a;
      if (((ulong)local_a0 & 1) != 0) {
        EVar6 = 0x32;
      }
      if (this == local_80) {
        return EVar6;
      }
    }
    pOVar17 = local_70;
    if ((uVar26 & 0x8c0000) != 0) {
      if ((InstDB::_commonInfoTable[local_c0 * 8 + 2] & 0x80) == 0) goto LAB_00146ada;
      if (((uVar26 >> 0x17 & 1) != 0) && ((InstDB::_commonInfoTable[local_c0 * 8 + 4] & 2) == 0)) {
        return 0x28;
      }
      if ((uVar26 & 0xc0000) != 0) {
        if (local_d0 != (Operand_ *)0x0) {
          return 0x2a;
        }
        if ((uVar26 >> 0x12 & 1) == 0) {
          uVar26 = *(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) & 8;
        }
        else {
          uVar26 = *(uint *)(InstDB::_commonInfoTable + local_c0 * 8 + 4) & 4;
        }
        if (uVar26 == 0) {
          return 0x2a;
        }
        validationFlags_00 = 0x15e370;
        if ((InstDB::_commonInfoTable[local_c0 * 8 + 4] & 0x70) != 0) {
          if ((ulong)OVar18 < 2) {
            validate();
            EVar6 = validate(kX64,(BaseInst *)pIStack_e0,(Operand_ *)inst,opCount_00,
                             validationFlags_00);
            return EVar6;
          }
          bVar3 = x86IsZmmOrM512(local_70);
          if ((!bVar3) && (bVar3 = x86IsZmmOrM512(pOVar17 + 1), !bVar3)) {
            return 0x2a;
          }
        }
      }
    }
    uVar26 = *(uint *)(local_88 + 8);
    if (uVar26 == 0) {
      local_d8 = 0;
    }
    else if (local_8c == 0) {
      local_d8 = 0x26;
      if ((((uVar26 & 0xf8) == 0x88) &&
          ((*(uint *)(InstDB::_commonInfoTable + local_c0 * 8) & 0x800000) != 0)) &&
         ((*(int *)(local_88 + 0xc) == 0 ||
          (local_d8 = 0, (InstDB::_commonInfoTable[local_c0 * 8 + 4] & 1) == 0)))) {
        local_d8 = 0x27;
      }
    }
    else if (((((short)local_c4 < 0) ||
              (*(uint *)(local_88 + 0xc) < 0xff && *(uint *)(local_88 + 0xc) != 1)) ||
             (local_d0 == (Operand_ *)0x0)) ||
            (local_d8 = 0, ((uVar26 ^ (local_d0->_signature)._bits) & 0xf8) != 0)) {
      local_d8 = 0x26;
    }
  }
  else {
LAB_00146ada:
    local_d8 = 0x1a;
  }
  return local_d8;
}

Assistant:

static ASMJIT_FAVOR_SIZE Error validate(InstDB::Mode mode, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  uint32_t i;

  // Get the instruction data.
  const X86ValidationData* vd = (mode == InstDB::Mode::kX86) ? &_x86ValidationData : &_x64ValidationData;
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}